

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecFunction(Parser *this,string *msg,bool emptyAllowed)

{
  pointer puVar1;
  CompileContext *pCVar2;
  int iVar3;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *pvVar4;
  pointer puVar5;
  CompileContext *pCVar6;
  size_type __dnew;
  undefined1 local_a0 [8];
  undefined1 local_98 [32];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_78;
  undefined1 local_58 [32];
  CompileContext *local_38;
  
  expectTypenamePrecUnary(this,msg,emptyAllowed);
  if (*(int *)&msg[7]._M_dataplus._M_p == 0x18) {
    advance((Parser *)msg);
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar6 = this->m_context;
    iVar3 = (**(_func_int **)((long)(pCVar6->m_source)._M_dataplus._M_p + 0x18))(pCVar6);
    if (iVar3 == 3) {
      this->m_context = (CompileContext *)0x0;
      pvVar4 = TupleTypename::elementTypenames((TupleTypename *)pCVar6);
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      puVar5 = (pvVar4->
               super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (pvVar4->
               super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (puVar5 == puVar1) {
        puVar5 = (pointer)0x0;
        local_98._0_4_ = 0;
        local_98._4_4_ = 0;
        local_98._8_4_ = 0;
        local_98._12_4_ = 0;
      }
      else {
        local_38 = pCVar6;
        do {
          (*((puVar5->_M_t).
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2]
          )(local_a0);
          local_58._0_8_ = local_a0;
          local_a0 = (undefined1  [8])0x0;
          std::
          vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
          ::
          emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                    ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                      *)local_98,
                     (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                      *)local_58);
          if ((_Head_base<0UL,_const_enact::Typename_*,_false>)local_58._0_8_ !=
              (_Head_base<0UL,_const_enact::Typename_*,_false>)0x0) {
            (*(*(_func_int ***)local_58._0_8_)[1])();
          }
          local_58._0_8_ =
               (_Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                )0x0;
          if (local_a0 != (undefined1  [8])0x0) {
            (**(_func_int **)((long)(((string *)local_a0)->_M_dataplus)._M_p + 8))();
          }
          puVar5 = puVar5 + 1;
        } while (puVar5 != puVar1);
        puVar5 = (pointer)local_98._16_8_;
        pCVar6 = local_38;
      }
      local_58._8_8_ =
           local_78.
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58._0_8_ =
           local_78.
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(local_98._4_4_,local_98._0_4_);
      local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(local_98._12_4_,local_98._8_4_)
      ;
      local_58._16_8_ =
           local_78.
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar5;
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                 *)local_58);
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                 *)local_98);
      (**(_func_int **)((long)(pCVar6->m_source)._M_dataplus._M_p + 8))(pCVar6);
    }
    else {
      std::
      vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
      ::
      emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                  *)&local_78,
                 (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 this);
    }
    local_98._0_8_ = (pointer)0x24;
    local_58._0_8_ = (long)local_58 + 0x10;
    local_58._0_8_ = std::__cxx11::string::_M_create((ulong *)local_58,(ulong)local_98);
    local_58._16_8_ = local_98._0_8_;
    builtin_strncpy((char *)(local_58._0_8_ + 0x10),"typename",8);
    builtin_strncpy((char *)(local_58._0_8_ + 0x18)," after \'",8);
    *(undefined8 *)local_58._0_8_ = 0x6465746365707845;
    builtin_strncpy((char *)(local_58._0_8_ + 8)," return ",8);
    builtin_strncpy((char *)(local_58._0_8_ + 0x20),"=>\'.",4);
    local_58._8_8_ = local_98._0_8_;
    *(char *)(local_98._0_8_ + local_58._0_8_) = '\0';
    expectTypenamePrecFunction((Parser *)local_a0,msg,SUB81(local_58,0));
    if (local_58._0_8_ != (long)local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
    }
    pCVar6 = (CompileContext *)operator_new(0x48);
    local_98._0_8_ = local_a0;
    local_a0 = (undefined1  [8])0x0;
    local_58._0_8_ =
         local_78.
         super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._8_8_ =
         local_78.
         super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58._16_8_ =
         local_78.
         super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FunctionTypename::FunctionTypename
              ((FunctionTypename *)pCVar6,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_98,(vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                         *)local_58);
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               *)local_58);
    if ((CompileContext *)local_98._0_8_ != (CompileContext *)0x0) {
      (**(_func_int **)
         ((long)*(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
                  *)local_98._0_8_ + 8))();
    }
    pCVar2 = this->m_context;
    this->m_context = pCVar6;
    if (pCVar2 != (CompileContext *)0x0) {
      (**(code **)((pCVar2->m_source)._M_dataplus._M_p + 8))();
    }
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_a0)->_M_dataplus)._M_p + 8))();
    }
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector(&local_78);
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecFunction(const std::string& msg, bool emptyAllowed) {
        std::unique_ptr<const Typename> typename_ = expectTypenamePrecUnary(msg, emptyAllowed);

        if (consume(TokenType::EQUAL_GREATER)) {
            std::vector<std::unique_ptr<const Typename>> parameterTypenames;
            if (typename_->kind() == Typename::Kind::TUPLE) {
                parameterTypenames = cloneAll(
                        static_unique_ptr_cast<const TupleTypename>(
                                std::move(typename_))
                                ->elementTypenames());
            } else {
                parameterTypenames.push_back(std::move(typename_));
            }

            std::unique_ptr<const Typename> returnTypename =
                    expectTypename("Expected return typename after '=>'.");

            typename_ = std::make_unique<FunctionTypename>(std::move(returnTypename), std::move(parameterTypenames));
        }

        return typename_;
    }